

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  pointer *pppEVar1;
  UnitTestImpl *pUVar2;
  iterator __position;
  Environment *local_18;
  Environment *env_local;
  
  if (env == (Environment *)0x0) {
    env = (Environment *)0x0;
  }
  else {
    pUVar2 = this->impl_;
    __position._M_current =
         (pUVar2->environments_).
         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pUVar2->environments_).
        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_18 = env;
      std::vector<testing::Environment*,std::allocator<testing::Environment*>>::
      _M_realloc_insert<testing::Environment*const&>
                ((vector<testing::Environment*,std::allocator<testing::Environment*>> *)
                 &pUVar2->environments_,__position,&local_18);
      env = local_18;
    }
    else {
      *__position._M_current = env;
      pppEVar1 = &(pUVar2->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return env;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == nullptr) {
    return nullptr;
  }

  impl_->environments().push_back(env);
  return env;
}